

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

VkDescriptorSetLayout __thiscall
vkt::image::anon_unknown_0::ImageStoreTestInstance::prepareDescriptors(ImageStoreTestInstance *this)

{
  deInt32 *pdVar1;
  Move<vk::Handle<(vk::HandleType)21>_> *pMVar2;
  uint numDescriptors;
  VkDescriptorSetLayout obj;
  VkDescriptorPool obj_00;
  pointer pSVar3;
  long *plVar4;
  VkImage VVar5;
  pointer pSVar6;
  SharedPtrStateBase *pSVar7;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  Handle<(vk::HandleType)21> HVar8;
  DeviceInterface *pDVar9;
  VkDevice pVVar10;
  VkAllocationCallbacks *pVVar11;
  Handle<(vk::HandleType)19> HVar12;
  ImageType imageType;
  VkImageViewType VVar13;
  DeviceInterface *vk;
  VkDevice device;
  DescriptorSetLayoutBuilder *pDVar14;
  DescriptorPoolBuilder *pDVar15;
  deUint64 *pdVar16;
  long *plVar17;
  int *piVar18;
  Unique<vk::Handle<(vk::HandleType)22>_> *pUVar19;
  SharedPtrStateBase *pSVar20;
  Unique<vk::Handle<(vk::HandleType)13>_> *pUVar21;
  deInt32 *pdVar22;
  Move<vk::Handle<(vk::HandleType)19>_> *pMVar23;
  long lVar24;
  ulong uVar25;
  VkImageSubresourceRange res;
  VkImageSubresourceRange res_1;
  Move<vk::Handle<(vk::HandleType)21>_> local_188;
  Move<vk::Handle<(vk::HandleType)19>_> *local_160;
  Move<vk::Handle<(vk::HandleType)19>_> local_158;
  Move<vk::Handle<(vk::HandleType)22>_> local_138;
  Move<vk::Handle<(vk::HandleType)22>_> local_118;
  Move<vk::Handle<(vk::HandleType)13>_> local_f8;
  Move<vk::Handle<(vk::HandleType)13>_> local_d8;
  Move<vk::Handle<(vk::HandleType)21>_> *local_b8;
  undefined8 local_b0;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_a0;
  DescriptorSetLayoutBuilder local_98;
  undefined8 local_48;
  undefined8 uStack_40;
  uint local_38;
  
  vk = Context::getDeviceInterface
                 ((this->super_StoreTestInstance).super_BaseTestInstance.super_TestInstance.
                  m_context);
  device = Context::getDevice((this->super_StoreTestInstance).super_BaseTestInstance.
                              super_TestInstance.m_context);
  numDescriptors = (this->super_StoreTestInstance).super_BaseTestInstance.m_texture.m_numLayers;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_98);
  pDVar14 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (&local_98,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
  pDVar14 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (pDVar14,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build(&local_158,pDVar14,vk,device,0);
  pVVar11 = local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  pVVar10 = local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  pDVar9 = local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  HVar12.m_internal =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar23 = &this->m_descriptorSetLayout;
  obj.m_internal =
       (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
       m_internal;
  if (obj.m_internal == 0) {
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_device = pVVar10;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_allocator = pVVar11;
    (pMVar23->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
         HVar12.m_internal;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_deviceIface = pDVar9;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                deleter,obj);
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_device = local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_allocator = local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                  m_allocator;
    (pMVar23->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
         local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_deviceIface =
         local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
    if (local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                (&local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,
                 (VkDescriptorSetLayout)
                 local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
    }
  }
  local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_98.m_immutableSamplers.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_immutableSamplers.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.m_immutableSamplerInfos.
      super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_immutableSamplerInfos.
                    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_158);
  pDVar15 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_158,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                       numDescriptors);
  pDVar15 = ::vk::DescriptorPoolBuilder::addType
                      (pDVar15,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,numDescriptors);
  ::vk::DescriptorPoolBuilder::build(&local_188,pDVar15,vk,device,1,numDescriptors);
  pVVar11 = local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  pVVar10 = local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  pDVar9 = local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  HVar8.m_internal =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_98.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  local_98.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  local_98.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_98.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                m_deviceIface;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar2 = &this->m_descriptorPool;
  obj_00.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  if (obj_00.m_internal == 0) {
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = pVVar10;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = pVVar11;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
         HVar8.m_internal;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface = pDVar9;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj_00);
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = (VkDevice)
           local_98.m_bindings.
           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)
                  local_98.m_immutableSamplerInfos.
                  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
         (deUint64)
         local_98.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface =
         (DeviceInterface *)
         local_98.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                (&local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter,
                 (VkDescriptorPool)
                 local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal);
    }
  }
  local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if ((void *)local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal !=
      (void *)0x0) {
    operator_delete((void *)local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                            m_internal,
                    (long)local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                          m_device -
                    local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                    m_internal);
  }
  if ((this->super_StoreTestInstance).super_BaseTestInstance.m_singleLayerBind == true) {
    if (0 < (int)numDescriptors) {
      lVar24 = 8;
      uVar25 = 0;
      local_160 = (Move<vk::Handle<(vk::HandleType)19>_> *)(ulong)numDescriptors;
      local_b8 = pMVar2;
      do {
        makeDescriptorSet(&local_118,vk,device,
                          (VkDescriptorPool)
                          (local_b8->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.
                          m_internal,
                          (VkDescriptorSetLayout)
                          (pMVar23->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                          m_internal);
        pdVar16 = (deUint64 *)operator_new(0x20);
        pdVar16[2] = (deUint64)
                     local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_device;
        pdVar16[3] = local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
                     m_internal;
        *pdVar16 = local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal
        ;
        pdVar16[1] = (deUint64)
                     local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_deviceIface;
        local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
        local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
             0;
        plVar17 = (long *)operator_new(0x20);
        *(undefined4 *)(plVar17 + 1) = 0;
        *(undefined4 *)((long)plVar17 + 0xc) = 0;
        *plVar17 = (long)&PTR__SharedPtrState_00d24b90;
        plVar17[2] = (long)pdVar16;
        *(undefined4 *)(plVar17 + 1) = 1;
        *(undefined4 *)((long)plVar17 + 0xc) = 1;
        pSVar3 = (this->m_allDescriptorSets).
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        plVar4 = *(long **)((long)&pSVar3->m_ptr + lVar24);
        if (plVar4 != plVar17) {
          if (plVar4 != (long *)0x0) {
            LOCK();
            plVar4 = plVar4 + 1;
            *(int *)plVar4 = (int)*plVar4 + -1;
            UNLOCK();
            if ((int)*plVar4 == 0) {
              *(undefined8 *)((long)pSVar3 + lVar24 + -8) = 0;
              (**(code **)(**(long **)((long)&pSVar3->m_ptr + lVar24) + 0x10))();
            }
            LOCK();
            piVar18 = (int *)(*(long *)((long)&pSVar3->m_ptr + lVar24) + 0xc);
            *piVar18 = *piVar18 + -1;
            UNLOCK();
            if (*piVar18 == 0) {
              plVar4 = *(long **)((long)&pSVar3->m_ptr + lVar24);
              if (plVar4 != (long *)0x0) {
                (**(code **)(*plVar4 + 8))();
              }
              *(undefined8 *)((long)&pSVar3->m_ptr + lVar24) = 0;
            }
          }
          *(deUint64 **)((long)pSVar3 + lVar24 + -8) = pdVar16;
          *(long **)((long)&pSVar3->m_ptr + lVar24) = plVar17;
          LOCK();
          *(int *)(plVar17 + 1) = (int)plVar17[1] + 1;
          UNLOCK();
          LOCK();
          piVar18 = (int *)(*(long *)((long)&pSVar3->m_ptr + lVar24) + 0xc);
          *piVar18 = *piVar18 + 1;
          UNLOCK();
        }
        plVar4 = plVar17 + 1;
        LOCK();
        *(int *)plVar4 = (int)*plVar4 + -1;
        UNLOCK();
        if ((int)*plVar4 == 0) {
          (**(code **)(*plVar17 + 0x10))(plVar17);
        }
        piVar18 = (int *)((long)plVar17 + 0xc);
        LOCK();
        *piVar18 = *piVar18 + -1;
        UNLOCK();
        if (*piVar18 == 0) {
          (**(code **)(*plVar17 + 8))(plVar17);
        }
        if ((pointer)local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                     m_internal != (pointer)0x0) {
          local_98.m_bindings.
          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                        m_internal;
          (*(local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)
            ->_vptr_DeviceInterface[0x3d])
                    (local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_deviceIface,
                     local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_device,local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                              deleter.m_pool.m_internal,1,&local_98);
        }
        local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
             0;
        local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
        local_118.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        VVar5.m_internal =
             (((this->m_image).
               super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.
              ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
        imageType = getImageTypeForSingleLayer
                              ((this->super_StoreTestInstance).super_BaseTestInstance.m_texture.
                               m_type);
        VVar13 = mapImageViewType(imageType);
        local_b0 = 1;
        uStack_a8 = 1;
        uStack_a4 = (undefined4)uVar25;
        local_a0 = 1;
        subresourceRange.baseArrayLayer = uStack_a4;
        subresourceRange.levelCount = 1;
        subresourceRange.aspectMask = 1;
        subresourceRange.baseMipLevel = 0;
        subresourceRange.layerCount = 1;
        makeImageView(&local_f8,vk,device,VVar5,VVar13,
                      (this->super_StoreTestInstance).super_BaseTestInstance.m_format,
                      subresourceRange);
        pdVar16 = (deUint64 *)operator_new(0x20);
        pdVar16[2] = (deUint64)
                     local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
        ;
        pdVar16[3] = (deUint64)
                     local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_allocator;
        *pdVar16 = local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
        pdVar16[1] = (deUint64)
                     local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_deviceIface;
        local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        plVar17 = (long *)operator_new(0x20);
        *(undefined4 *)(plVar17 + 1) = 0;
        *(undefined4 *)((long)plVar17 + 0xc) = 0;
        *plVar17 = (long)&PTR__SharedPtrState_00d24850;
        plVar17[2] = (long)pdVar16;
        *(undefined4 *)(plVar17 + 1) = 1;
        *(undefined4 *)((long)plVar17 + 0xc) = 1;
        pSVar6 = (this->m_allImageViews).
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        plVar4 = *(long **)((long)&pSVar6->m_ptr + lVar24);
        if (plVar4 != plVar17) {
          if (plVar4 != (long *)0x0) {
            LOCK();
            plVar4 = plVar4 + 1;
            *(int *)plVar4 = (int)*plVar4 + -1;
            UNLOCK();
            if ((int)*plVar4 == 0) {
              *(undefined8 *)((long)pSVar6 + lVar24 + -8) = 0;
              (**(code **)(**(long **)((long)&pSVar6->m_ptr + lVar24) + 0x10))();
            }
            LOCK();
            piVar18 = (int *)(*(long *)((long)&pSVar6->m_ptr + lVar24) + 0xc);
            *piVar18 = *piVar18 + -1;
            UNLOCK();
            if (*piVar18 == 0) {
              plVar4 = *(long **)((long)&pSVar6->m_ptr + lVar24);
              if (plVar4 != (long *)0x0) {
                (**(code **)(*plVar4 + 8))();
              }
              *(undefined8 *)((long)&pSVar6->m_ptr + lVar24) = 0;
            }
          }
          *(deUint64 **)((long)pSVar6 + lVar24 + -8) = pdVar16;
          *(long **)((long)&pSVar6->m_ptr + lVar24) = plVar17;
          LOCK();
          *(int *)(plVar17 + 1) = (int)plVar17[1] + 1;
          UNLOCK();
          LOCK();
          piVar18 = (int *)(*(long *)((long)&pSVar6->m_ptr + lVar24) + 0xc);
          *piVar18 = *piVar18 + 1;
          UNLOCK();
        }
        plVar4 = plVar17 + 1;
        LOCK();
        *(int *)plVar4 = (int)*plVar4 + -1;
        UNLOCK();
        if ((int)*plVar4 == 0) {
          (**(code **)(*plVar17 + 0x10))(plVar17);
        }
        piVar18 = (int *)((long)plVar17 + 0xc);
        LOCK();
        *piVar18 = *piVar18 + -1;
        UNLOCK();
        if (*piVar18 == 0) {
          (**(code **)(*plVar17 + 8))(plVar17);
        }
        if (local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    (&local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                     (VkImageView)
                     local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                     m_internal);
        }
        local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        uVar25 = uVar25 + 1;
        lVar24 = lVar24 + 0x10;
      } while (local_160 != (Move<vk::Handle<(vk::HandleType)19>_> *)uVar25);
    }
  }
  else {
    makeDescriptorSet(&local_138,vk,device,
                      (VkDescriptorPool)
                      (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.
                      m_internal,
                      (VkDescriptorSetLayout)
                      (pMVar23->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                      m_internal);
    pUVar19 = (Unique<vk::Handle<(vk::HandleType)22>_> *)operator_new(0x20);
    (pUVar19->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device =
         local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
    (pUVar19->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.m_internal =
         local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal;
    *(deUint64 *)&(pUVar19->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data =
         local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    (pUVar19->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface =
         local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface;
    local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
    local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal = 0;
    local_160 = pMVar23;
    pSVar20 = (SharedPtrStateBase *)operator_new(0x20);
    pdVar1 = &pSVar20->strongRefCount;
    pSVar20->strongRefCount = 0;
    pSVar20->weakRefCount = 0;
    pSVar20->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d24b90;
    pSVar20[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar19;
    pSVar20->strongRefCount = 1;
    pSVar20->weakRefCount = 1;
    pSVar3 = (this->m_allDescriptorSets).
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = pSVar3->m_state;
    if (pSVar7 != pSVar20) {
      if (pSVar7 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar22 = &pSVar7->strongRefCount;
        *pdVar22 = *pdVar22 + -1;
        UNLOCK();
        if (*pdVar22 == 0) {
          pSVar3->m_ptr = (Unique<vk::Handle<(vk::HandleType)22>_> *)0x0;
          (*pSVar3->m_state->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar22 = &pSVar3->m_state->weakRefCount;
        *pdVar22 = *pdVar22 + -1;
        UNLOCK();
        if (*pdVar22 == 0) {
          if (pSVar3->m_state != (SharedPtrStateBase *)0x0) {
            (*pSVar3->m_state->_vptr_SharedPtrStateBase[1])();
          }
          pSVar3->m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar3->m_ptr = pUVar19;
      pSVar3->m_state = pSVar20;
      LOCK();
      pSVar20->strongRefCount = pSVar20->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar22 = &pSVar3->m_state->weakRefCount;
      *pdVar22 = *pdVar22 + 1;
      UNLOCK();
    }
    pdVar22 = &pSVar20->weakRefCount;
    LOCK();
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (*pSVar20->_vptr_SharedPtrStateBase[2])(pSVar20);
    }
    LOCK();
    *pdVar22 = *pdVar22 + -1;
    UNLOCK();
    if (*pdVar22 == 0) {
      (*pSVar20->_vptr_SharedPtrStateBase[1])(pSVar20);
    }
    if ((pointer)local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal
        != (pointer)0x0) {
      local_98.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                    m_internal;
      (*(local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x3d])
                (local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                 m_deviceIface,
                 local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
                 local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
                 m_internal,1);
    }
    local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal = 0;
    local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
    local_138.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    VVar5.m_internal =
         (((this->m_image).
           super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.ptr)->
         m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    VVar13 = mapImageViewType((this->super_StoreTestInstance).super_BaseTestInstance.m_texture.
                              m_type);
    local_48 = 1;
    uStack_40 = 1;
    subresourceRange_00.levelCount = 1;
    subresourceRange_00.baseArrayLayer = 0;
    subresourceRange_00.aspectMask = 1;
    subresourceRange_00.baseMipLevel = 0;
    subresourceRange_00.layerCount = numDescriptors;
    local_38 = numDescriptors;
    makeImageView(&local_d8,vk,device,VVar5,VVar13,
                  (this->super_StoreTestInstance).super_BaseTestInstance.m_format,
                  subresourceRange_00);
    pUVar21 = (Unique<vk::Handle<(vk::HandleType)13>_> *)operator_new(0x20);
    (pUVar21->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
         local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    (pUVar21->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
         local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    *(deUint64 *)&(pUVar21->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data =
         local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    (pUVar21->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
    local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
    local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    pSVar20 = (SharedPtrStateBase *)operator_new(0x20);
    pdVar1 = &pSVar20->strongRefCount;
    pSVar20->strongRefCount = 0;
    pSVar20->weakRefCount = 0;
    pSVar20->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d24850;
    pSVar20[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar21;
    pSVar20->strongRefCount = 1;
    pSVar20->weakRefCount = 1;
    pSVar6 = (this->m_allImageViews).
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = pSVar6->m_state;
    if (pSVar7 != pSVar20) {
      if (pSVar7 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar22 = &pSVar7->strongRefCount;
        *pdVar22 = *pdVar22 + -1;
        UNLOCK();
        if (*pdVar22 == 0) {
          pSVar6->m_ptr = (Unique<vk::Handle<(vk::HandleType)13>_> *)0x0;
          (*pSVar6->m_state->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar22 = &pSVar6->m_state->weakRefCount;
        *pdVar22 = *pdVar22 + -1;
        UNLOCK();
        if (*pdVar22 == 0) {
          if (pSVar6->m_state != (SharedPtrStateBase *)0x0) {
            (*pSVar6->m_state->_vptr_SharedPtrStateBase[1])();
          }
          pSVar6->m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar6->m_ptr = pUVar21;
      pSVar6->m_state = pSVar20;
      LOCK();
      pSVar20->strongRefCount = pSVar20->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar22 = &pSVar6->m_state->weakRefCount;
      *pdVar22 = *pdVar22 + 1;
      UNLOCK();
    }
    pdVar22 = &pSVar20->weakRefCount;
    LOCK();
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (*pSVar20->_vptr_SharedPtrStateBase[2])(pSVar20);
    }
    pMVar23 = local_160;
    LOCK();
    *pdVar22 = *pdVar22 + -1;
    UNLOCK();
    if (*pdVar22 == 0) {
      (*pSVar20->_vptr_SharedPtrStateBase[1])(pSVar20);
    }
    if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImageView)
                 local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  return (VkDescriptorSetLayout)
         (pMVar23->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
}

Assistant:

VkDescriptorSetLayout ImageStoreTestInstance::prepareDescriptors (void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	const int numLayers = m_texture.numLayers();
	m_descriptorSetLayout = DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device);

	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, numLayers)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, numLayers);

	if (m_singleLayerBind)
	{
		for (int layerNdx = 0; layerNdx < numLayers; ++layerNdx)
		{
			m_allDescriptorSets[layerNdx] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
			m_allImageViews[layerNdx]     = makeVkSharedPtr(makeImageView(
												vk, device, m_image->get(), mapImageViewType(getImageTypeForSingleLayer(m_texture.type())), m_format,
												makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, layerNdx, 1u)));
		}
	}
	else // bind all layers at once
	{
		m_allDescriptorSets[0] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
		m_allImageViews[0] = makeVkSharedPtr(makeImageView(
								vk, device, m_image->get(), mapImageViewType(m_texture.type()), m_format,
								makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, numLayers)));
	}

	return *m_descriptorSetLayout;  // not passing the ownership
}